

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

int __thiscall
QToolBox::insertItem(QToolBox *this,int index,QWidget *widget,QIcon *icon,QString *text)

{
  QToolBoxPrivate *this_00;
  pointer puVar1;
  int iVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *paVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QScrollArea *this_02;
  ulong uVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QObject local_50 [8];
  _Head_base<0UL,_QToolBoxPrivate::Page_*,_false> local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    iVar2 = -1;
    goto LAB_004b825c;
  }
  this_00 = *(QToolBoxPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  QObject::connect(local_40,(char *)widget,(QObject *)"2destroyed(QObject*)",(char *)this,0x6e244d);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  paVar3 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)operator_new(0x18);
  paVar3->m_data = (void *)0x0;
  paVar3[1].m_data = (void *)0x0;
  paVar3[2].m_data = widget;
  local_48._M_head_impl = (Page *)paVar3;
  this_01.m_data = operator_new(0x30);
  QToolBoxButton::QToolBoxButton((QToolBoxButton *)this_01.m_data,(QWidget *)this);
  paVar3->m_data = (void *)this_01;
  QVar5.m_size = (size_t)"qt_toolbox_toolboxbutton";
  QVar5.field_0.m_data = this_01.m_data;
  QObject::setObjectName(QVar5);
  QObject::connect(local_50,paVar3->m_data_utf8,(QObject *)"2clicked()",(char *)this,0x6e2484);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  this_02 = (QScrollArea *)operator_new(0x28);
  QScrollArea::QScrollArea(this_02,(QWidget *)this);
  paVar3[1].m_data = this_02;
  QScrollArea::setWidget(this_02,widget);
  QScrollArea::setWidgetResizable((QScrollArea *)paVar3[1].m_data,true);
  QWidget::hide((QWidget *)paVar3[1].m_data);
  QFrame::setFrameStyle((QFrame *)paVar3[1].m_data,0);
  QAbstractButton::setText((QAbstractButton *)paVar3->m_data,text);
  QAbstractButton::setIcon((QAbstractButton *)paVar3->m_data,icon);
  if (index < 0) {
    uVar4 = (ulong)((long)(this_00->pageList).
                          super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->pageList).
                         super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
LAB_004b81d6:
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>,std::allocator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>>
    ::
    emplace_back<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>
              ((vector<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>,std::allocator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>>
                *)&this_00->pageList,
               (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
               &local_48);
    iVar2 = 0;
    QBoxLayout::addWidget
              (&this_00->layout->super_QBoxLayout,(QWidget *)paVar3->m_data,0,(Alignment)0x0);
    QBoxLayout::addWidget
              (&this_00->layout->super_QBoxLayout,(QWidget *)paVar3[1].m_data,0,(Alignment)0x0);
    index = 0;
    if ((int)uVar4 == 0) {
LAB_004b821b:
      setCurrentIndex(this,iVar2);
      goto LAB_004b8226;
    }
  }
  else {
    puVar1 = (this_00->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (ulong)((long)(this_00->pageList).
                          super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3;
    if ((int)uVar4 <= index) goto LAB_004b81d6;
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
    ::_M_insert_rval(&this_00->pageList,puVar1 + (uint)index,(value_type *)&local_48);
    QToolBoxPrivate::relayout(this_00);
    if (this_00->currentPage != (Page *)0x0) {
      iVar2 = indexOf(this,this_00->currentPage->widget);
      if (iVar2 < index) goto LAB_004b8226;
      this_00->currentPage = (Page *)0x0;
      goto LAB_004b821b;
    }
LAB_004b8226:
    uVar4 = (ulong)(uint)index;
  }
  iVar2 = (int)uVar4;
  QWidget::show((QWidget *)paVar3->m_data);
  QToolBoxPrivate::updateTabs(this_00);
  (**(code **)(*(long *)&(this->super_QFrame).super_QWidget + 0x1a8))(this,uVar4 & 0xffffffff);
  if ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)local_48._M_head_impl !=
      (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
    operator_delete(local_48._M_head_impl,0x18);
  }
LAB_004b825c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QToolBox::insertItem(int index, QWidget *widget, const QIcon &icon, const QString &text)
{
    if (!widget)
        return -1;

    Q_D(QToolBox);
    connect(widget, SIGNAL(destroyed(QObject*)), this, SLOT(_q_widgetDestroyed(QObject*)));

    auto newPage = std::make_unique<QToolBoxPrivate::Page>();
    auto &c = *newPage;
    c.widget = widget;
    c.button = new QToolBoxButton(this);
    c.button->setObjectName("qt_toolbox_toolboxbutton"_L1);
    connect(c.button, SIGNAL(clicked()), this, SLOT(_q_buttonClicked()));

    c.sv = new QScrollArea(this);
    c.sv->setWidget(widget);
    c.sv->setWidgetResizable(true);
    c.sv->hide();
    c.sv->setFrameStyle(QFrame::NoFrame);

    c.setText(text);
    c.setIcon(icon);

    if (index < 0 || index >= static_cast<int>(d->pageList.size())) {
        index = static_cast<int>(d->pageList.size());
        d->pageList.push_back(std::move(newPage));
        d->layout->addWidget(c.button);
        d->layout->addWidget(c.sv);
        if (index == 0)
            setCurrentIndex(index);
    } else {
        d->pageList.insert(d->pageList.cbegin() + index, std::move(newPage));
        d->relayout();
        if (d->currentPage) {
            QWidget *current = d->currentPage->widget;
            int oldindex = indexOf(current);
            if (index <= oldindex) {
                d->currentPage = nullptr; // trigger change
                setCurrentIndex(oldindex);
            }
        }
    }

    c.button->show();

    d->updateTabs();
    itemInserted(index);
    return index;
}